

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O0

int __thiscall pg::DTLSolver::best_vertices(DTLSolver *this,bitset *V,bitset *R,int player)

{
  unsigned_long *__first;
  undefined1 __first_00 [8];
  bool bVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  int iVar8;
  _label_vertex _Var9;
  byte local_2ca;
  byte local_2aa;
  _label_vertex local_228;
  undefined1 local_218 [24];
  int u_2;
  int x_1;
  int iStack_1f8;
  bool changed_V;
  int u_1;
  int x;
  int u;
  size_t v_4;
  int t;
  int max_prio;
  int local_1d0;
  int local_1cc;
  int v_3;
  int n_candidates;
  uint local_1b8;
  int local_1b4;
  int v_2;
  int pr;
  undefined1 local_1a0 [16];
  undefined1 local_190 [28];
  int top;
  int local_170;
  _label_vertex local_168;
  size_t local_158;
  size_t v_1;
  undefined1 local_148 [16];
  undefined1 local_138 [28];
  int v;
  undefined1 auStack_118 [3];
  bool hasV;
  int curdist;
  bitset CurZ;
  bitset CurR;
  undefined1 local_c8 [8];
  bitset Z;
  bitset prevV;
  int player_local;
  bitset *R_local;
  bitset *V_local;
  DTLSolver *this_local;
  char local_21;
  bitset *local_20;
  char local_11;
  bitset *local_10;
  
  bVar1 = bitset::none(V);
  if (!bVar1) {
    __assert_fail("V.none()",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/dtl.cpp"
                  ,0x288,"int pg::DTLSolver::best_vertices(bitset &, bitset &, const int)");
  }
  sVar4 = Solver::nodecount(&this->super_Solver);
  bitset::bitset((bitset *)&Z._allocsize,sVar4);
  sVar4 = Solver::nodecount(&this->super_Solver);
  bitset::bitset((bitset *)local_c8,sVar4);
  sVar4 = Solver::nodecount(&this->super_Solver);
  bitset::bitset((bitset *)&CurZ._allocsize,sVar4);
  sVar4 = Solver::nodecount(&this->super_Solver);
  bitset::bitset((bitset *)auStack_118,sVar4);
  v = 0;
  local_138[0x1b] = 0;
  for (local_138._20_4_ = 0; lVar5 = (long)(int)local_138._20_4_,
      lVar6 = Solver::nodecount(&this->super_Solver), lVar5 < lVar6;
      local_138._20_4_ = local_138._20_4_ + 1) {
    bitset::operator[]((bitset *)local_138,(size_t)R);
    bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_138);
    bVar1 = false;
    if (bVar2) {
      uVar3 = Solver::priority(&this->super_Solver,local_138._20_4_);
      bVar1 = (uVar3 & 1) == player;
    }
    if (bVar1) {
      local_138[0x1b] = 1;
      bitset::operator[]((bitset *)local_148,(size_t)V);
      bitset::reference::operator=((reference *)local_148,true);
    }
  }
  if ((local_138[0x1b] & 1) == 0) {
    this_local._0_4_ = 0;
  }
  else {
    do {
      v = v + 1;
      bitset::operator=((bitset *)&Z._allocsize,V);
      if (2 < (this->super_Solver).trace) {
        std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;202mcurrent best vertices:\x1b[m");
        for (local_158 = bitset::find_first(V); local_158 != 0xffffffffffffffff;
            local_158 = bitset::find_next(V,local_158)) {
          poVar7 = std::operator<<((this->super_Solver).logger," \x1b[1;38;5;15m");
          _Var9 = Solver::label_vertex(&this->super_Solver,(int)local_158);
          register0x00000000 = _Var9.g;
          local_170 = _Var9.v;
          local_168.g = register0x00000000;
          local_168.v = local_170;
          poVar7 = operator<<(poVar7,&local_168);
          std::operator<<(poVar7,"\x1b[m");
        }
        std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>)
        ;
      }
      bitset::operator=((bitset *)&CurZ._allocsize,R);
      lVar5 = Solver::nodecount(&this->super_Solver);
      local_190._20_4_ = (undefined4)lVar5;
      while (local_190._20_4_ = local_190._20_4_ - 1, -1 < (int)local_190._20_4_) {
        bitset::operator[]((bitset *)local_190,(size_t)V);
        bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_190);
        local_2aa = 0;
        if (bVar1) {
          bitset::operator[]((bitset *)local_1a0,(size_t)local_c8);
          bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_1a0);
          local_2aa = bVar1 ^ 0xff;
        }
        if ((local_2aa & 1) != 0) {
          bitset::operator[]((bitset *)&v_2,(size_t)auStack_118);
          bitset::reference::operator=((reference *)&v_2,true);
          this->str[(int)local_190._20_4_] = -1;
          iVar8 = (this->Q).pointer;
          (this->Q).pointer = iVar8 + 1;
          (this->Q).queue[iVar8] = local_190._20_4_;
          local_1b4 = Solver::priority(&this->super_Solver,local_190._20_4_);
          while ((this->Q).pointer != 0) {
            iVar8 = (this->Q).pointer + -1;
            (this->Q).pointer = iVar8;
            local_1b8 = (this->Q).queue[iVar8];
            bitset::operator[]((bitset *)&v_3,(size_t)&CurZ._allocsize);
            bitset::reference::operator=((reference *)&v_3,false);
            attractVertices(this,player,local_1b8,(bitset *)&CurZ._allocsize,(bitset *)auStack_118,
                            (bitset *)&CurZ._allocsize,local_1b4);
            attractTangles(this,player,local_1b8,(bitset *)&CurZ._allocsize,(bitset *)auStack_118,
                           (bitset *)&CurZ._allocsize,local_1b4);
          }
          bitset::operator|=((bitset *)local_c8,(bitset *)auStack_118);
          __first = _auStack_118;
          local_10 = (bitset *)auStack_118;
          sVar4 = bitset::num_blocks(local_10);
          local_11 = '\0';
          std::fill<unsigned_long*,char>(__first,__first + sVar4,&local_11);
        }
      }
      local_1cc = 0;
      lVar5 = Solver::nodecount(&this->super_Solver);
      local_1d0 = (int)lVar5;
      while (local_1d0 = local_1d0 + -1, -1 < local_1d0) {
        bitset::operator[]((bitset *)&t,(size_t)V);
        bVar1 = bitset::reference::operator_cast_to_bool((reference *)&t);
        local_2ca = 0;
        if (bVar1) {
          bVar1 = attracts(this,player,local_1d0,(bitset *)local_c8,R);
          local_2ca = bVar1 ^ 0xff;
        }
        if ((local_2ca & 1) != 0) {
          this->Candidates[local_1cc] = local_1d0;
          local_1cc = local_1cc + 1;
        }
      }
      if (local_1cc == 0) {
        this_local._0_4_ = 1;
        goto LAB_00239b8e;
      }
      lVar5 = Solver::nodecount(&this->super_Solver);
      v_4._4_4_ = Solver::priority(&this->super_Solver,(int)lVar5 + -1);
      for (v_4._0_4_ = 0; (int)v_4 <= v_4._4_4_; v_4._0_4_ = (int)v_4 + 1) {
        for (_x = bitset::find_first((bitset *)local_c8); _x != 0xffffffffffffffff;
            _x = bitset::find_next((bitset *)local_c8,_x)) {
          iVar8 = (this->Q).pointer;
          (this->Q).pointer = iVar8 + 1;
          (this->Q).queue[iVar8] = (uint)_x;
        }
        while ((this->Q).pointer != 0) {
          iVar8 = (this->Q).pointer + -1;
          (this->Q).pointer = iVar8;
          u_1 = (this->Q).queue[iVar8];
          attractVertices(this,player,u_1,R,(bitset *)local_c8,R,(int)v_4);
          attractTangles(this,player,u_1,R,(bitset *)local_c8,R,(int)v_4);
        }
        for (iStack_1f8 = 0; iStack_1f8 < local_1cc; iStack_1f8 = iStack_1f8 + 1) {
          x_1 = this->Candidates[iStack_1f8];
          if (x_1 != -1) {
            iVar8 = Solver::priority(&this->super_Solver,x_1);
            if (iVar8 <= (int)v_4) break;
            bVar1 = attracts(this,player,x_1,(bitset *)local_c8,R);
            if (bVar1) {
              this->Candidates[iStack_1f8] = -1;
            }
          }
        }
      }
      u_2._3_1_ = 0;
      for (local_218._20_4_ = 0; (int)local_218._20_4_ < local_1cc;
          local_218._20_4_ = local_218._20_4_ + 1) {
        local_218._16_4_ = this->Candidates[(int)local_218._20_4_];
        if (local_218._16_4_ != -1) {
          bitset::operator[]((bitset *)local_218,(size_t)V);
          bitset::reference::operator=((reference *)local_218,false);
          if (1 < (this->super_Solver).trace) {
            if ((u_2._3_1_ & 1) == 0) {
              poVar7 = std::operator<<((this->super_Solver).logger,"\x1b[1;38;5;202mdistance ");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,v);
              std::operator<<(poVar7,"\x1b[m:");
            }
            poVar7 = std::operator<<((this->super_Solver).logger," \x1b[1;36m");
            _Var9 = Solver::label_vertex(&this->super_Solver,local_218._16_4_);
            local_228.g = _Var9.g;
            local_228.v = _Var9.v;
            poVar7 = operator<<(poVar7,&local_228);
            std::operator<<(poVar7,"\x1b[m");
          }
          u_2._3_1_ = 1;
        }
      }
      if ((u_2._3_1_ != 0) && (0 < (this->super_Solver).trace)) {
        std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>)
        ;
      }
      __first_00 = local_c8;
      local_20 = (bitset *)local_c8;
      sVar4 = bitset::num_blocks(local_20);
      local_21 = '\0';
      std::fill<unsigned_long*,char>
                ((unsigned_long *)__first_00,(unsigned_long *)((long)__first_00 + sVar4 * 8),
                 &local_21);
      if ((u_2._3_1_ & 1) == 0) {
        this_local._0_4_ = 1;
        goto LAB_00239b8e;
      }
      bVar1 = bitset::any(V);
    } while (bVar1);
    bitset::swap(V,(bitset *)&Z._allocsize);
    this_local._0_4_ = -1;
  }
LAB_00239b8e:
  v_1._4_4_ = 1;
  bitset::~bitset((bitset *)auStack_118);
  bitset::~bitset((bitset *)&CurZ._allocsize);
  bitset::~bitset((bitset *)local_c8);
  bitset::~bitset((bitset *)&Z._allocsize);
  return (int)this_local;
}

Assistant:

int
DTLSolver::best_vertices(bitset &V, bitset &R, const int player)
{
#ifndef NDEBUG
    // Assume: V is empty
    assert(V.none());
#endif

    bitset prevV(nodecount()); // the previous V
    bitset Z(nodecount()); // the current Z
    bitset CurR(nodecount());
    bitset CurZ(nodecount());
    int curdist = 0;

    /**
     * Initialize V := vertices in <R> with priority of <player>
     */

    bool hasV = false;
    for (int v=0; v<nodecount(); v++) {
        if (R[v] and (priority(v)&1) == player) {
            hasV = true;
            V[v] = true;
        }
    }
    if (!hasV) return 0;

    /**
     * Now we prune until no more vertices are removed from V, or V is empty.
     */

    while (true) {
        curdist++;
        prevV = V;

#ifndef NDEBUG
        if (trace >= 3) {
            logger << "\033[1;38;5;202mcurrent best vertices:\033[m";
            for (auto v = V.find_first(); v != bitset::npos; v = V.find_next(v)) {
                logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
            }
            logger << std::endl;
        }
#endif

        // First compute the current <player> region Z

        CurR = R;
        for (int top=nodecount()-1; top>=0; top--) {
            if (V[top] and !Z[top]) {
                CurZ[top] = true; // add to <Z>
                str[top] = -1; // don't care, but needed for correct trace reporting
                Q.push(top);
                const int pr = priority(top);
                while (Q.nonempty()) {
                    const int v = Q.pop();
                    CurR[v] = false;
                    attractVertices(player, v, CurR, CurZ, CurR, pr);
                    attractTangles(player, v, CurR, CurZ, CurR, pr);
                }
                Z |= CurZ;
                CurZ.reset();
            }
        }

        /**
         * Now find all Candidates: v \in V that do not yet have a good path to Z
         */

        int n_candidates = 0;
        for (int v=nodecount()-1; v>=0; v--) {
            if (V[v] and !attracts(player, v, Z, R)) Candidates[n_candidates++] = v;
        }
        if (n_candidates == 0) return 1; // no more vertices are removed

        // Now attract from R to Z, "slowly"
        // Note: we have to be carefully increasing t. Why?
        // because we might attract tangles OR vertices at some threshold...
        const int max_prio = priority(nodecount()-1);
        for (int t=0; t<=max_prio; t++) {
            // add vertices in Z to Q
            for (auto v = Z.find_first(); v != bitset::npos; v = Z.find_next(v)) Q.push(v);

            // run tangle attractor to Z with the given threshold
            while (Q.nonempty()) {
                const int u = Q.pop();
                attractVertices(player, u, R, Z, R, t);
                attractTangles(player, u, R, Z, R, t);
            }

            // Now check if any candidate is now attracted (via the good path)
            for (int x=0; x<n_candidates; x++) {
                const int u = Candidates[x];
                if (u != -1) {
                    if (priority(u) <= t) break; // stop checking once we are below the threshold
                    if (attracts(player, u, Z, R)) Candidates[x] = -1;
                }
            }
        }

        /**
         * We have now attracted all possible vertices to <Z>.
         * Any remaining vertices in Candidates are now distractions...
         */

        bool changed_V = false;
        for (int x=0; x<n_candidates; x++) {
            const int u = Candidates[x];
            if (u == -1) continue;
            V[u] = false;
            if (trace >= 2) {
                if (!changed_V) {
                    logger << "\033[1;38;5;202mdistance " << curdist << "\033[m:";
                }
                logger << " \033[1;36m" << label_vertex(u) << "\033[m";
            }
            changed_V = true;
        }
        if (changed_V and trace >= 1) logger << std::endl;

        Z.reset();

        if (!changed_V) {
            // No vertices were removed from V
            return 1;
        } else if (!V.any()) {
            // All vertices were removed from V
            V.swap(prevV);
            return -1;
        }
    }

    return true;
}